

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paladin.c
# Opt level: O0

void spell_arms_of_wrath(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  undefined2 uVar2;
  OBJ_DATA *obj;
  CHAR_DATA *in_RDX;
  undefined2 in_SI;
  int in_EDI;
  OBJ_AFFECT_DATA oaf;
  AFFECT_DATA af;
  OBJ_DATA *weapon;
  char arg [4608];
  AFFECT_DATA *in_stack_ffffffffffffed18;
  char *in_stack_ffffffffffffed20;
  undefined2 in_stack_ffffffffffffed28;
  undefined2 in_stack_ffffffffffffed2a;
  undefined2 uVar3;
  undefined2 in_stack_ffffffffffffed2c;
  undefined2 in_stack_ffffffffffffed2e;
  short sVar4;
  undefined2 in_stack_ffffffffffffed30;
  undefined2 in_stack_ffffffffffffed32;
  undefined2 uVar5;
  undefined2 in_stack_ffffffffffffed34;
  undefined2 uVar6;
  undefined2 in_stack_ffffffffffffed36;
  CHAR_DATA *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  CHAR_DATA *in_stack_ffffffffffffff38;
  
  target_name = one_argument(in_stack_ffffffffffffed20,(char *)in_stack_ffffffffffffed18);
  obj = get_obj_carry(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28)
  ;
  if (obj == (OBJ_DATA *)0x0) {
    send_to_char((char *)CONCAT26(in_stack_ffffffffffffed36,
                                  CONCAT24(in_stack_ffffffffffffed34,
                                           CONCAT22(in_stack_ffffffffffffed32,
                                                    in_stack_ffffffffffffed30))),
                 (CHAR_DATA *)
                 CONCAT26(in_stack_ffffffffffffed2e,
                          CONCAT24(in_stack_ffffffffffffed2c,
                                   CONCAT22(in_stack_ffffffffffffed2a,in_stack_ffffffffffffed28))));
  }
  else if (obj->item_type == 5) {
    bVar1 = is_affected(in_RDX,in_EDI);
    if (bVar1) {
      send_to_char((char *)CONCAT26(in_stack_ffffffffffffed36,
                                    CONCAT24(in_stack_ffffffffffffed34,
                                             CONCAT22(in_stack_ffffffffffffed32,
                                                      in_stack_ffffffffffffed30))),
                   (CHAR_DATA *)
                   CONCAT26(in_stack_ffffffffffffed2e,
                            CONCAT24(in_stack_ffffffffffffed2c,
                                     CONCAT22(in_stack_ffffffffffffed2a,in_stack_ffffffffffffed28)))
                  );
    }
    else {
      bVar1 = is_affected_obj(obj,(int)gsn_arms_of_light);
      if ((((!bVar1) && (bVar1 = is_affected_obj(obj,(int)gsn_arms_of_purity), !bVar1)) &&
          (bVar1 = is_affected_obj(obj,(int)gsn_arms_of_wrath), !bVar1)) &&
         (bVar1 = is_affected_obj(obj,(int)gsn_arms_of_judgement), !bVar1)) {
        init_affect_obj((OBJ_AFFECT_DATA *)0x765974);
        uVar3 = 0;
        uVar2 = (undefined2)in_EDI;
        uVar5 = 0;
        uVar6 = 0;
        sVar4 = in_RDX->level;
        affect_to_obj((OBJ_DATA *)in_RDX,(OBJ_AFFECT_DATA *)in_stack_ffffffffffffed18);
        act((char *)CONCAT26(in_stack_ffffffffffffed36,CONCAT24(uVar6,CONCAT22(uVar5,in_SI))),
            (CHAR_DATA *)CONCAT26(sVar4,CONCAT24(uVar2,CONCAT22(uVar3,in_stack_ffffffffffffed28))),
            in_RDX,in_stack_ffffffffffffed18,0);
        act((char *)CONCAT26(in_stack_ffffffffffffed36,CONCAT24(uVar6,CONCAT22(uVar5,in_SI))),
            (CHAR_DATA *)CONCAT26(sVar4,CONCAT24(uVar2,CONCAT22(uVar3,in_stack_ffffffffffffed28))),
            in_RDX,in_stack_ffffffffffffed18,0);
        init_affect((AFFECT_DATA *)0x765a2d);
        affect_to_char(in_RDX,in_stack_ffffffffffffed18);
        WAIT_STATE((CHAR_DATA *)
                   CONCAT26(in_stack_ffffffffffffed36,CONCAT24(uVar6,CONCAT22(uVar5,in_SI))),
                   CONCAT22(sVar4,uVar2));
        return;
      }
      send_to_char((char *)CONCAT26(in_stack_ffffffffffffed36,
                                    CONCAT24(in_stack_ffffffffffffed34,
                                             CONCAT22(in_stack_ffffffffffffed32,
                                                      in_stack_ffffffffffffed30))),
                   (CHAR_DATA *)
                   CONCAT26(in_stack_ffffffffffffed2e,
                            CONCAT24(in_stack_ffffffffffffed2c,
                                     CONCAT22(in_stack_ffffffffffffed2a,in_stack_ffffffffffffed28)))
                  );
    }
  }
  else {
    send_to_char((char *)CONCAT26(in_stack_ffffffffffffed36,
                                  CONCAT24(in_stack_ffffffffffffed34,
                                           CONCAT22(in_stack_ffffffffffffed32,
                                                    in_stack_ffffffffffffed30))),
                 (CHAR_DATA *)
                 CONCAT26(in_stack_ffffffffffffed2e,
                          CONCAT24(in_stack_ffffffffffffed2c,
                                   CONCAT22(in_stack_ffffffffffffed2a,in_stack_ffffffffffffed28))));
  }
  return;
}

Assistant:

void spell_arms_of_wrath(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	char arg[MSL];
	OBJ_DATA *weapon;
	AFFECT_DATA af;
	OBJ_AFFECT_DATA oaf;

	target_name = one_argument(target_name, arg);

	if ((weapon = get_obj_carry(ch, arg, ch)) == nullptr)
	{
		send_to_char("You aren't carrying that.\n\r", ch);
		return;
	}

	if (weapon->item_type != ITEM_WEAPON)
	{
		send_to_char("You can only commune this upon weapons.\n\r", ch);
		return;
	}

	if (is_affected(ch, sn))
	{
		send_to_char("You may not commune this supplication again yet.\n\r", ch);
		return;
	}

	if (is_affected_obj(weapon, gsn_arms_of_light)
		|| is_affected_obj(weapon, gsn_arms_of_purity)
		|| is_affected_obj(weapon, gsn_arms_of_wrath)
		|| is_affected_obj(weapon, gsn_arms_of_judgement))
	{
		send_to_char("This weapon is already enchanted with holy power!\n\r", ch);
		return;
	}

	init_affect_obj(&oaf);
	oaf.where = TO_OBJ_AFFECTS;
	oaf.type = sn;
	oaf.aftype = AFT_COMMUNE;
	oaf.location = APPLY_NONE;
	oaf.modifier = 0;
	oaf.duration = level;
	oaf.level = ch->level;
	oaf.owner = ch;
	affect_to_obj(weapon, &oaf);

	act("$n's $p is set ablaze with white flames!", ch, weapon, 0, TO_ROOM);
	act("You enchant $p with holy wrath.", ch, weapon, 0, TO_CHAR);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.type = sn;
	af.location = APPLY_NONE;
	af.modifier = 0;
	af.aftype = AFT_TIMER;
	af.duration = ch->level;
	af.level = ch->level;
	affect_to_char(ch, &af);

	WAIT_STATE(ch, PULSE_VIOLENCE * 2);
}